

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_draw_gizmo(rf_vec3 position)

{
  rf_mat *prVar1;
  rf_mat left;
  undefined1 auVar2 [40];
  rf_mat mat_scale;
  float local_a8;
  float fStack_a4;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  rf_gfx_push_matrix();
  local_a8 = position.x;
  fStack_a4 = position.y;
  rf_gfx_translatef(local_a8,fStack_a4,position.z);
  prVar1 = (rf__ctx->field_0).current_matrix;
  auVar2 = ZEXT2440(CONCAT816(0x3f80000000000000,ZEXT816(0x3f800000)));
  left.m10 = 1.0;
  left.m14 = 0.0;
  left.m0 = (float)auVar2._0_4_;
  left.m4 = (float)auVar2._4_4_;
  left.m8 = (float)auVar2._8_4_;
  left.m12 = (float)auVar2._12_4_;
  left.m1 = (float)auVar2._16_4_;
  left.m5 = (float)auVar2._20_4_;
  left.m9 = (float)auVar2._24_4_;
  left.m13 = (float)auVar2._28_4_;
  left.m2 = (float)auVar2._32_4_;
  left.m6 = (float)auVar2._36_4_;
  left.m3 = 0.0;
  left.m7 = 0.0;
  left.m11 = 0.0;
  left.m15 = 1.0;
  rf_mat_mul(left,*prVar1);
  prVar1->m3 = (float)(undefined4)local_20;
  prVar1->m7 = (float)local_20._4_4_;
  prVar1->m11 = (float)(undefined4)uStack_18;
  prVar1->m15 = (float)uStack_18._4_4_;
  prVar1->m2 = (float)(undefined4)local_30;
  prVar1->m6 = (float)local_30._4_4_;
  prVar1->m10 = (float)(undefined4)uStack_28;
  prVar1->m14 = (float)uStack_28._4_4_;
  prVar1->m1 = (float)(undefined4)local_40;
  prVar1->m5 = (float)local_40._4_4_;
  prVar1->m9 = (float)(undefined4)uStack_38;
  prVar1->m13 = (float)uStack_38._4_4_;
  prVar1->m0 = (float)(undefined4)local_50;
  prVar1->m4 = (float)local_50._4_4_;
  prVar1->m8 = (float)(undefined4)uStack_48;
  prVar1->m12 = (float)uStack_48._4_4_;
  rf_gfx_begin(RF_LINES);
  rf_gfx_color4ub(0xff,'\0','\0',0xff);
  rf_gfx_vertex3f(0.0,0.0,0.0);
  rf_gfx_color4ub(0xff,'\0','\0',0xff);
  rf_gfx_vertex3f(1.0,0.0,0.0);
  rf_gfx_color4ub('\0',0xff,'\0',0xff);
  rf_gfx_vertex3f(0.0,0.0,0.0);
  rf_gfx_color4ub('\0',0xff,'\0',0xff);
  rf_gfx_vertex3f(0.0,1.0,0.0);
  rf_gfx_color4ub('\0','\0',0xff,0xff);
  rf_gfx_vertex3f(0.0,0.0,0.0);
  rf_gfx_color4ub('\0','\0',0xff,0xff);
  rf_gfx_vertex3f(0.0,0.0,1.0);
  rf_gfx_end();
  rf_gfx_pop_matrix();
  return;
}

Assistant:

RF_API void rf_draw_gizmo(rf_vec3 position)
{
    // NOTE: RGB = XYZ
    float length = 1.0f;

    rf_gfx_push_matrix();
    rf_gfx_translatef(position.x, position.y, position.z);
    rf_gfx_scalef(length, length, length);

    rf_gfx_begin(RF_LINES);
    rf_gfx_color3f(1.0f, 0.0f, 0.0f); rf_gfx_vertex3f(0.0f, 0.0f, 0.0f);
    rf_gfx_color3f(1.0f, 0.0f, 0.0f); rf_gfx_vertex3f(1.0f, 0.0f, 0.0f);

    rf_gfx_color3f(0.0f, 1.0f, 0.0f); rf_gfx_vertex3f(0.0f, 0.0f, 0.0f);
    rf_gfx_color3f(0.0f, 1.0f, 0.0f); rf_gfx_vertex3f(0.0f, 1.0f, 0.0f);

    rf_gfx_color3f(0.0f, 0.0f, 1.0f); rf_gfx_vertex3f(0.0f, 0.0f, 0.0f);
    rf_gfx_color3f(0.0f, 0.0f, 1.0f); rf_gfx_vertex3f(0.0f, 0.0f, 1.0f);
    rf_gfx_end();
    rf_gfx_pop_matrix();
}